

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void walCleanupHash(Wal *pWal)

{
  uint uVar1;
  int iVar2;
  u32 *puVar3;
  u32 *puVar4;
  long lVar5;
  int iPage;
  u32 *local_18;
  
  uVar1 = (pWal->hdr).mxFrame;
  local_18 = (u32 *)(ulong)uVar1;
  if (uVar1 != 0) {
    iPage = (int)((ulong)(uVar1 + 0x1000) + 0xffffffff021 >> 0xc);
    iVar2 = walIndexPage(pWal,iPage,&local_18);
    puVar3 = local_18;
    if (iVar2 == 0) {
      if (iPage == 0) {
        local_18 = local_18 + 0x22;
        iVar2 = 0;
      }
      else {
        iVar2 = iPage * 0x1000 + -0x22;
      }
      puVar3 = puVar3 + 0x1000;
      puVar4 = local_18 + -1;
    }
    else {
      puVar3 = (u32 *)0x0;
      puVar4 = (u32 *)0x0;
      iVar2 = 0;
    }
    iVar2 = (pWal->hdr).mxFrame - iVar2;
    lVar5 = 0;
    do {
      if (iVar2 < (int)(uint)*(ushort *)((long)puVar3 + lVar5 * 2)) {
        *(undefined2 *)((long)puVar3 + lVar5 * 2) = 0;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x2000);
    memset(puVar4 + (long)iVar2 + 1,0,(long)((int)puVar3 - (int)(puVar4 + (long)iVar2 + 1)));
    return;
  }
  return;
}

Assistant:

static void walCleanupHash(Wal *pWal){
  volatile ht_slot *aHash = 0;    /* Pointer to hash table to clear */
  volatile u32 *aPgno = 0;        /* Page number array for hash table */
  u32 iZero = 0;                  /* frame == (aHash[x]+iZero) */
  int iLimit = 0;                 /* Zero values greater than this */
  int nByte;                      /* Number of bytes to zero in aPgno[] */
  int i;                          /* Used to iterate through aHash[] */

  assert( pWal->writeLock );
  testcase( pWal->hdr.mxFrame==HASHTABLE_NPAGE_ONE-1 );
  testcase( pWal->hdr.mxFrame==HASHTABLE_NPAGE_ONE );
  testcase( pWal->hdr.mxFrame==HASHTABLE_NPAGE_ONE+1 );

  if( pWal->hdr.mxFrame==0 ) return;

  /* Obtain pointers to the hash-table and page-number array containing 
  ** the entry that corresponds to frame pWal->hdr.mxFrame. It is guaranteed
  ** that the page said hash-table and array reside on is already mapped.
  */
  assert( pWal->nWiData>walFramePage(pWal->hdr.mxFrame) );
  assert( pWal->apWiData[walFramePage(pWal->hdr.mxFrame)] );
  walHashGet(pWal, walFramePage(pWal->hdr.mxFrame), &aHash, &aPgno, &iZero);

  /* Zero all hash-table entries that correspond to frame numbers greater
  ** than pWal->hdr.mxFrame.
  */
  iLimit = pWal->hdr.mxFrame - iZero;
  assert( iLimit>0 );
  for(i=0; i<HASHTABLE_NSLOT; i++){
    if( aHash[i]>iLimit ){
      aHash[i] = 0;
    }
  }
  
  /* Zero the entries in the aPgno array that correspond to frames with
  ** frame numbers greater than pWal->hdr.mxFrame. 
  */
  nByte = (int)((char *)aHash - (char *)&aPgno[iLimit+1]);
  memset((void *)&aPgno[iLimit+1], 0, nByte);

#ifdef SQLITE_ENABLE_EXPENSIVE_ASSERT
  /* Verify that the every entry in the mapping region is still reachable
  ** via the hash table even after the cleanup.
  */
  if( iLimit ){
    int j;           /* Loop counter */
    int iKey;        /* Hash key */
    for(j=1; j<=iLimit; j++){
      for(iKey=walHash(aPgno[j]); aHash[iKey]; iKey=walNextHash(iKey)){
        if( aHash[iKey]==j ) break;
      }
      assert( aHash[iKey]==j );
    }
  }
#endif /* SQLITE_ENABLE_EXPENSIVE_ASSERT */
}